

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabConv.cpp
# Opt level: O1

void amrex::RealDescriptor::convertFromNativeFloatFormat
               (ostream *os,Long nitems,float *in,RealDescriptor *od)

{
  bool bVar1;
  long lVar2;
  void *out;
  RealDescriptor *ord;
  RealDescriptor *ird;
  IntDescriptor *pIVar3;
  IntDescriptor *nitems_00;
  StreamRetry sr;
  IntDescriptor *iid;
  float *pfVar4;
  string local_b8;
  StreamRetry local_98;
  
  lVar2 = (long)writeBufferSize;
  if (nitems <= writeBufferSize) {
    lVar2 = nitems;
  }
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"RD_cFNF","");
  StreamRetry::StreamRetry(&local_98,os,&local_b8,4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  while (bVar1 = StreamRetry::TryOutput(&local_98), bVar1) {
    out = operator_new__((*(od->fr).super_vector<long,_std::allocator<long>_>.
                           super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start * 0x20000000 + 0xe0000000 >> 0x20) *
                         lVar2);
    iid = (IntDescriptor *)nitems;
    pfVar4 = in;
    if (0 < nitems) {
      do {
        nitems_00 = (IntDescriptor *)(long)writeBufferSize;
        if (nitems < writeBufferSize) {
          nitems_00 = (IntDescriptor *)nitems;
        }
        ord = FPC::Native32RealDescriptor();
        ird = (RealDescriptor *)FPC::NativeLongDescriptor();
        PD_convert(out,in,(Long)nitems_00,(int)od,ord,ird,iid,(int)pfVar4);
        std::ostream::write((char *)os,(long)out);
        in = in + (long)nitems_00;
        pIVar3 = (IntDescriptor *)(nitems - (long)nitems_00);
        bVar1 = (long)nitems_00 <= nitems;
        nitems = (Long)pIVar3;
      } while (pIVar3 != (IntDescriptor *)0x0 && bVar1);
    }
    operator_delete__(out);
    nitems = (Long)iid;
    in = pfVar4;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.suffix._M_dataplus._M_p != &local_98.suffix.field_2) {
    operator_delete(local_98.suffix._M_dataplus._M_p,
                    local_98.suffix.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.fileName._M_dataplus._M_p != &local_98.fileName.field_2) {
    operator_delete(local_98.fileName._M_dataplus._M_p,
                    local_98.fileName.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
RealDescriptor::convertFromNativeFloatFormat (std::ostream&         os,
                                              Long                  nitems,
                                              const float*          in,
                                              const RealDescriptor& od)
{
//  BL_PROFILE("RD:convertFromNativeFloatFormat");
  Long nitemsSave(nitems);
  Long buffSize(std::min(Long(writeBufferSize), nitems));
  const float *inSave(in);
  amrex::StreamRetry sr(os, "RD_cFNF", 4);

  while(sr.TryOutput()) {
    nitems = nitemsSave;
    in = inSave;

    char *bufr = new char[buffSize * od.numBytes()];

    while (nitems > 0)
    {
        Long put = std::min(static_cast<Long>(writeBufferSize), nitems);
        PD_convert(bufr,
                   in,
                   put,
                   0,
                   od,
                   FPC::Native32RealDescriptor(),
                   FPC::NativeLongDescriptor());
        os.write(bufr, od.numBytes()*put);
        nitems -= put;
        in     += put;
    }

    delete [] bufr;
  }
}